

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::Q_from_NasaAngles(ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *mang)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [56];
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  dVar1 = cos(mang->m_data[2] * 0.5);
  dVar2 = sin(mang->m_data[2] * 0.5);
  dVar3 = cos(mang->m_data[0] * 0.5);
  dVar4 = sin(mang->m_data[0] * 0.5);
  dVar5 = cos(mang->m_data[1] * 0.5);
  auVar7._0_8_ = sin(mang->m_data[1] * 0.5);
  auVar7._8_56_ = extraout_var;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1 * dVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4 * dVar2 * auVar7._0_8_;
  auVar6 = vfmadd231sd_fma(auVar12,auVar8,auVar14);
  __return_storage_ptr__->m_data[0] = auVar6._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5 * dVar4 * dVar2;
  auVar6 = vfmsub231sd_fma(auVar10,auVar7._0_16_,auVar8);
  __return_storage_ptr__->m_data[1] = auVar6._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4 * dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2 * dVar3 * auVar7._0_8_;
  auVar6 = vfmadd231sd_fma(auVar13,auVar9,auVar14);
  __return_storage_ptr__->m_data[2] = auVar6._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar7._0_8_ * dVar4 * dVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2 * dVar3;
  auVar6 = vfmsub231sd_fma(auVar6,auVar11,auVar14);
  __return_storage_ptr__->m_data[3] = auVar6._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Q_from_NasaAngles(const ChVector<double>& mang) {
    ChQuaternion<double> mq;
    double c1 = cos(mang.z() / 2);
    double s1 = sin(mang.z() / 2);
    double c2 = cos(mang.x() / 2);
    double s2 = sin(mang.x() / 2);
    double c3 = cos(mang.y() / 2);
    double s3 = sin(mang.y() / 2);
    double c1c2 = c1 * c2;
    double s1s2 = s1 * s2;
    mq.e0() = c1c2 * c3 + s1s2 * s3;
    mq.e1() = c1c2 * s3 - s1s2 * c3;
    mq.e2() = c1 * s2 * c3 + s1 * c2 * s3;
    mq.e3() = s1 * c2 * c3 - c1 * s2 * s3;
    return mq;
}